

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O2

double __thiscall
fasttext::Meter::recallAtPrecision(Meter *this,int32_t labelId,double precisionQuery)

{
  double dVar1;
  double dVar2;
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_20;
  
  precisionRecallCurve
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &local_20,this,labelId);
  dVar1 = 0.0;
  for (; local_20._M_impl.super__Vector_impl_data._M_start !=
         local_20._M_impl.super__Vector_impl_data._M_finish;
      local_20._M_impl.super__Vector_impl_data._M_start =
           local_20._M_impl.super__Vector_impl_data._M_start + 1) {
    dVar2 = dVar1;
    if ((precisionQuery <= (local_20._M_impl.super__Vector_impl_data._M_start)->first) &&
       (dVar2 = (local_20._M_impl.super__Vector_impl_data._M_start)->second,
       (local_20._M_impl.super__Vector_impl_data._M_start)->second <= dVar1)) {
      dVar2 = dVar1;
    }
    dVar1 = dVar2;
  }
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_20);
  return dVar1;
}

Assistant:

double Meter::recallAtPrecision(int32_t labelId, double precisionQuery) const {
  const auto& precisionRecall = precisionRecallCurve(labelId);
  double bestRecall = 0.0;
  std::for_each(
      precisionRecall.begin(),
      precisionRecall.end(),
      [&bestRecall, precisionQuery](const std::pair<double, double>& element) {
        if (element.first >= precisionQuery) {
          bestRecall = std::max(bestRecall, element.second);
        };
      });
  return bestRecall;
}